

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlCtxtReset(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlDictPtr dict;
  xmlParserInputPtr *ppxVar2;
  int *piVar3;
  xmlParserNsData *pxVar4;
  int iVar5;
  xmlParserInputPtr pxVar6;
  uint uVar7;
  xmlChar *pxVar8;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  dict = ctxt->dict;
  while (uVar1 = ctxt->inputNr, 0 < (int)uVar1) {
    uVar7 = uVar1 - 1;
    ctxt->inputNr = uVar7;
    ppxVar2 = ctxt->inputTab;
    if (uVar1 == 1) {
      pxVar6 = (xmlParserInputPtr)0x0;
    }
    else {
      pxVar6 = ppxVar2[(ulong)uVar1 - 2];
    }
    ctxt->input = pxVar6;
    pxVar6 = ppxVar2[uVar7];
    ppxVar2[uVar7] = (xmlParserInputPtr)0x0;
    if (pxVar6 == (xmlParserInputPtr)0x0) break;
    xmlFreeInputStream(pxVar6);
  }
  ctxt->inputNr = 0;
  ctxt->input = (xmlParserInputPtr)0x0;
  ctxt->spaceNr = 0;
  piVar3 = ctxt->spaceTab;
  if (piVar3 != (int *)0x0) {
    *piVar3 = -1;
  }
  ctxt->space = piVar3;
  ctxt->nodeNr = 0;
  ctxt->node = (xmlNodePtr)0x0;
  ctxt->nameNr = 0;
  ctxt->name = (xmlChar *)0x0;
  ctxt->nsNr = 0;
  pxVar4 = ctxt->nsdb;
  if (pxVar4 != (xmlParserNsData *)0x0) {
    pxVar4->hashElems = 0;
    pxVar4->elementId = 0;
    pxVar4->defaultNsIndex = 0x7fffffff;
    if (pxVar4->hash != (xmlParserNsBucket *)0x0) {
      memset(pxVar4->hash,0,(ulong)pxVar4->hashSize << 3);
    }
  }
  pxVar8 = ctxt->version;
  if (pxVar8 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar5 = xmlDictOwns(dict,pxVar8);
      if (iVar5 != 0) goto LAB_001402ea;
      pxVar8 = ctxt->version;
    }
    (*xmlFree)(pxVar8);
  }
LAB_001402ea:
  ctxt->version = (xmlChar *)0x0;
  pxVar8 = ctxt->encoding;
  if (pxVar8 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar5 = xmlDictOwns(dict,pxVar8);
      if (iVar5 != 0) goto LAB_0014031c;
      pxVar8 = ctxt->encoding;
    }
    (*xmlFree)(pxVar8);
  }
LAB_0014031c:
  ctxt->encoding = (xmlChar *)0x0;
  pxVar8 = ctxt->extSubURI;
  if (pxVar8 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar5 = xmlDictOwns(dict,pxVar8);
      if (iVar5 != 0) goto LAB_00140354;
      pxVar8 = ctxt->extSubURI;
    }
    (*xmlFree)(pxVar8);
  }
LAB_00140354:
  ctxt->extSubURI = (xmlChar *)0x0;
  pxVar8 = ctxt->extSubSystem;
  if (pxVar8 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar5 = xmlDictOwns(dict,pxVar8);
      if (iVar5 != 0) goto LAB_0014038f;
      pxVar8 = ctxt->extSubSystem;
    }
    (*xmlFree)(pxVar8);
  }
LAB_0014038f:
  ctxt->extSubSystem = (xmlChar *)0x0;
  if (ctxt->directory != (char *)0x0) {
    (*xmlFree)(ctxt->directory);
    ctxt->directory = (char *)0x0;
  }
  if (ctxt->myDoc != (xmlDocPtr)0x0) {
    xmlFreeDoc(ctxt->myDoc);
  }
  ctxt->myDoc = (xmlDocPtr)0x0;
  ctxt->standalone = -1;
  ctxt->html = 0;
  ctxt->hasPErefs = 0;
  ctxt->instate = XML_PARSER_START;
  ctxt->wellFormed = 1;
  ctxt->nsWellFormed = 1;
  ctxt->disableSAX = 0;
  ctxt->inSubset = 0;
  ctxt->valid = 1;
  ctxt->record_info = 0;
  ctxt->checkIndex = 0;
  ctxt->endCheckState = 0;
  ctxt->errNo = 0;
  ctxt->hasExternalSubset = 0;
  ctxt->depth = 0;
  ctxt->catalogs = (void *)0x0;
  ctxt->sizeentities = 0;
  ctxt->sizeentcopy = 0;
  xmlInitNodeInfoSeq(&ctxt->node_seq);
  if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
    ctxt->attsDefault = (xmlHashTablePtr)0x0;
  }
  if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
    ctxt->attsSpecial = (xmlHashTablePtr)0x0;
  }
  if (ctxt->catalogs != (void *)0x0) {
    xmlCatalogFreeLocal(ctxt->catalogs);
  }
  ctxt->nbErrors = 0;
  ctxt->nbWarnings = 0;
  if ((ctxt->lastError).code == 0) {
    return;
  }
  xmlResetError(&ctxt->lastError);
  return;
}

Assistant:

void
xmlCtxtReset(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;
    xmlDictPtr dict;

    if (ctxt == NULL)
        return;

    dict = ctxt->dict;

    while ((input = xmlCtxtPopInput(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->spaceNr = 0;
    if (ctxt->spaceTab != NULL) {
	ctxt->spaceTab[0] = -1;
	ctxt->space = &ctxt->spaceTab[0];
    } else {
        ctxt->space = NULL;
    }


    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    ctxt->nameNr = 0;
    ctxt->name = NULL;

    ctxt->nsNr = 0;
    xmlParserNsReset(ctxt->nsdb);

    DICT_FREE(ctxt->version);
    ctxt->version = NULL;
    DICT_FREE(ctxt->encoding);
    ctxt->encoding = NULL;
    DICT_FREE(ctxt->extSubURI);
    ctxt->extSubURI = NULL;
    DICT_FREE(ctxt->extSubSystem);
    ctxt->extSubSystem = NULL;

    if (ctxt->directory != NULL) {
        xmlFree(ctxt->directory);
        ctxt->directory = NULL;
    }

    if (ctxt->myDoc != NULL)
        xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 0;
    ctxt->instate = XML_PARSER_START;

    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->disableSAX = 0;
    ctxt->valid = 1;
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->endCheckState = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->catalogs = NULL;
    ctxt->sizeentities = 0;
    ctxt->sizeentcopy = 0;
    xmlInitNodeInfoSeq(&ctxt->node_seq);

    if (ctxt->attsDefault != NULL) {
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
        ctxt->attsDefault = NULL;
    }
    if (ctxt->attsSpecial != NULL) {
        xmlHashFree(ctxt->attsSpecial, NULL);
        ctxt->attsSpecial = NULL;
    }

#ifdef LIBXML_CATALOG_ENABLED
    if (ctxt->catalogs != NULL)
	xmlCatalogFreeLocal(ctxt->catalogs);
#endif
    ctxt->nbErrors = 0;
    ctxt->nbWarnings = 0;
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlResetError(&ctxt->lastError);
}